

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::undo_move(Board *this,Point *source,Point *destination,shared_ptr<Piece> *original)

{
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<Piece> *psVar1;
  shared_ptr<Piece> *this_02;
  shared_ptr<Piece> *original_local;
  Point *destination_local;
  Point *source_local;
  Board *this_local;
  
  this_00 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,destination);
  this_01 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_00);
  Piece::undo_last_move(this_01);
  psVar1 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,destination);
  this_02 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,source);
  std::shared_ptr<Piece>::operator=(this_02,psVar1);
  psVar1 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,destination);
  std::shared_ptr<Piece>::operator=(psVar1,original);
  return;
}

Assistant:

void Board::undo_move(const Point &source, const Point &destination, shared_ptr<Piece> original) {
    m_board[destination]->undo_last_move();
    m_board[source] = move(m_board[destination]);
    // Revive the previous piece if such exists.
    m_board[destination] = move(original);
}